

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O1

void dryup(xchar x,xchar y,boolean isyou)

{
  undefined1 *puVar1;
  monst *mtmp;
  level *plVar2;
  boolean bVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  int x_00;
  int iVar7;
  undefined7 in_register_00000031;
  int iVar8;
  undefined7 in_register_00000039;
  int y_00;
  
  iVar8 = (int)CONCAT71(in_register_00000039,x);
  iVar7 = (int)CONCAT71(in_register_00000031,y);
  if ((level->locations[iVar8][iVar7].typ == '\x1c') &&
     ((uVar5 = mt_random(), uVar5 * -0x55555555 < 0x55555556 ||
      ((level->locations[iVar8][iVar7].field_0x6 & 0x20) != 0)))) {
    x_00 = (int)x;
    y_00 = (int)y;
    if ((isyou != '\0') &&
       ((bVar3 = in_town(x_00,y_00), bVar3 != '\0' &&
        (uVar5 = *(uint *)&level->locations[iVar8][iVar7].field_0x6, (uVar5 & 0x20) == 0)))) {
      *(uint *)&level->locations[iVar8][iVar7].field_0x6 = uVar5 | 0x20;
      mtmp = level->monlist;
      while( true ) {
        if (mtmp == (monst *)0x0) {
          pline("The flow reduces to a trickle.");
          return;
        }
        if ((((0 < mtmp->mhp) && (mtmp->data == mons + 0x126 || mtmp->data == mons + 0x125)) &&
            ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->field_0x62 & 0x40) != 0)) break;
        mtmp = mtmp->nmon;
      }
      pcVar6 = Amonnam(mtmp);
      pline("%s yells:",pcVar6);
      verbalize("Hey, stop using that fountain!");
      return;
    }
    if (((isyou == '\0') || (flags.debug == '\0')) ||
       (cVar4 = yn_function("Dry up fountain?","yn",'n'), cVar4 != 'n')) {
      plVar2 = level;
      level->locations[iVar8][iVar7].typ = '\x19';
      puVar1 = &plVar2->locations[iVar8][iVar7].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
      puVar1 = &level->locations[iVar8][iVar7].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffdff;
      if ((viz_array[iVar7][iVar8] & 2U) != 0) {
        pline("The fountain dries up!");
      }
      newsym(x_00,y_00);
      (level->flags).nfountains = (level->flags).nfountains + 0xff;
      if ((isyou != '\0') && (bVar3 = in_town(x_00,y_00), bVar3 != '\0')) {
        angry_guards('\0');
        return;
      }
    }
  }
  return;
}

Assistant:

void dryup(xchar x, xchar y, boolean isyou)
{
	if (IS_FOUNTAIN(level->locations[x][y].typ) &&
	    (!rn2(3) || FOUNTAIN_IS_WARNED(x,y))) {
		if (isyou && in_town(x, y) && !FOUNTAIN_IS_WARNED(x,y)) {
			struct monst *mtmp;
			SET_FOUNTAIN_WARNED(x,y);
			/* Warn about future fountain use. */
			for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
			    if (DEADMONSTER(mtmp)) continue;
			    if ((mtmp->data == &mons[PM_WATCHMAN] ||
				mtmp->data == &mons[PM_WATCH_CAPTAIN]) &&
			       couldsee(mtmp->mx, mtmp->my) &&
			       mtmp->mpeaceful) {
				pline("%s yells:", Amonnam(mtmp));
				verbalize("Hey, stop using that fountain!");
				break;
			    }
			}
			/* You can see or hear this effect */
			if (!mtmp) pline("The flow reduces to a trickle.");
			return;
		}
		
		if (isyou && wizard) {
			if (yn("Dry up fountain?") == 'n')
				return;
		}
		
		/* replace the fountain with ordinary floor */
		level->locations[x][y].typ = ROOM;
		level->locations[x][y].looted = 0;
		level->locations[x][y].blessedftn = 0;
		if (cansee(x,y)) pline("The fountain dries up!");
		/* The location is seen if the hero/monster is invisible */
		/* or felt if the hero is blind.			 */
		newsym(x, y);
		level->flags.nfountains--;
		if (isyou && in_town(x, y))
		    angry_guards(FALSE);
	}
}